

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall
helics::Federate::updateSimulationTime(Federate *this,Time newTime,Time oldTime,bool iterating)

{
  bool bVar1;
  undefined8 in_RDX;
  Federate *in_RSI;
  long *in_RDI;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffc0;
  undefined1 __args_1;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *in_stack_ffffffffffffffc8;
  Modes newMode;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffd0;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  __args_1 = (undefined1)((ulong)in_stack_ffffffffffffffc0.internalTimeCode >> 0x38);
  in_RDI[5] = (long)in_RSI;
  local_8.internalTimeCode = (baseType)in_RSI;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)0x20a589);
  if (bVar1) {
    std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::operator()
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,(bool)__args_1);
  }
  (**(code **)(*in_RDI + 0x50))(in_RDI,local_8.internalTimeCode,in_RDX);
  newMode = (Modes)((ulong)in_RDX >> 0x38);
  TimeRepresentation<count_time<9,_long>_>::maxVal();
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                    (&local_8,(TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffc0);
  if (bVar1) {
    updateFederateMode((Federate *)local_8.internalTimeCode,newMode);
  }
  return;
}

Assistant:

void Federate::updateSimulationTime(Time newTime, Time oldTime, bool iterating)
{
    mCurrentTime = newTime;
    if (timeUpdateCallback) {
        timeUpdateCallback(newTime, iterating);
    }
    updateTime(newTime, oldTime);
    if (newTime == Time::maxVal()) {
        updateFederateMode(Modes::FINISHED);
    }
}